

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmsio.c
# Opt level: O0

int FmsIOGetScalarArray(FmsIOContext *ctx,char *path,FmsScalarType *type,void **values,FmsInt *n)

{
  int iVar1;
  ulonglong uVar2;
  int *piVar3;
  FmsIOContext *ctx_00;
  void *pvVar4;
  size_t sVar5;
  char *pcVar6;
  undefined8 *in_RCX;
  uint *in_RDX;
  ulong uVar7;
  long in_RSI;
  long in_RDI;
  ulong *in_R8;
  float fVar8;
  double dVar9;
  char *newoff_3;
  char *off_3;
  size_t len_3;
  FmsInt i_3;
  double *data_3;
  char *newoff_2;
  char *off_2;
  size_t len_2;
  FmsInt i_2;
  float *data_2;
  char *newoff_1;
  char *off_1;
  size_t len_1;
  FmsInt i_1;
  double *data_1;
  char *newoff;
  char *off;
  size_t len;
  FmsInt i;
  float *data;
  char *kvalues;
  char *ktype;
  char *ksize;
  char v [512];
  char k [512];
  int err;
  char *in_stack_fffffffffffffaf8;
  undefined4 in_stack_fffffffffffffb00;
  undefined1 in_stack_fffffffffffffb04;
  undefined1 uVar10;
  undefined1 in_stack_fffffffffffffb05;
  undefined1 in_stack_fffffffffffffb06;
  undefined1 in_stack_fffffffffffffb07;
  char *in_stack_fffffffffffffb08;
  char *in_stack_fffffffffffffb10;
  char *local_4e8;
  ulong local_4d8;
  char *local_4c8;
  char *local_4c0;
  size_t local_4b8;
  ulong local_4b0;
  void *local_4a8;
  char *local_4a0;
  char *local_498;
  size_t local_490;
  ulong local_488;
  void *local_480;
  char *local_478;
  char *local_470;
  size_t local_468;
  ulong local_460;
  void *local_458;
  char *local_450;
  char *local_448;
  char *local_440;
  char local_438 [512];
  char local_238 [320];
  char *in_stack_ffffffffffffff08;
  char *in_stack_ffffffffffffff10;
  FmsIOContext *in_stack_ffffffffffffff18;
  int local_4;
  
  if (in_RDI == 0) {
    local_4 = 1;
  }
  else if (in_RSI == 0) {
    local_4 = 2;
  }
  else if (in_RDX == (uint *)0x0) {
    local_4 = 3;
  }
  else if (in_RCX == (undefined8 *)0x0) {
    local_4 = 4;
  }
  else if (in_R8 == (ulong *)0x0) {
    local_4 = 5;
  }
  else {
    iVar1 = FmsIOReadKeyValue(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                              in_stack_ffffffffffffff08);
    if (iVar1 == 0) {
      local_440 = join_keys(in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
      iVar1 = strcmp(local_238,local_440);
      if (local_440 != (char *)0x0) {
        free(local_440);
      }
      if (iVar1 == 0) {
        uVar2 = strtoull(local_438,(char **)0x0,10);
        *in_R8 = uVar2;
        piVar3 = __errno_location();
        if (*piVar3 == 0x22) {
          local_4 = 8;
        }
        else {
          piVar3 = __errno_location();
          if (*piVar3 == 0x16) {
            local_4 = 9;
          }
          else {
            iVar1 = FmsIOReadKeyValue(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                                      in_stack_ffffffffffffff08);
            if (iVar1 == 0) {
              local_448 = join_keys(in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
              iVar1 = strcmp(local_238,local_448);
              if (local_448 != (char *)0x0) {
                free(local_448);
              }
              if (iVar1 == 0) {
                iVar1 = FmsGetScalarTypeFromName
                                  (in_stack_fffffffffffffaf8,(FmsScalarType *)0x11bbba);
                if (iVar1 == 0) {
                  if (*in_R8 == 0) {
                    local_4 = 0;
                  }
                  else {
                    iVar1 = FmsIOReadKeyValue(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                                              in_stack_ffffffffffffff08);
                    if (iVar1 == 0) {
                      local_450 = join_keys(in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
                      iVar1 = strcmp(local_238,local_450);
                      if (local_450 != (char *)0x0) {
                        free(local_450);
                      }
                      if (iVar1 == 0) {
                        ctx_00 = (FmsIOContext *)(ulong)*in_RDX;
                        switch(ctx_00) {
                        case (FmsIOContext *)0x0:
                          local_458 = malloc(*in_R8 << 2);
                          local_460 = 0;
                          do {
                            local_468 = strlen(local_438);
                            local_470 = local_438;
                            local_478 = (char *)0x0;
                            if (local_438[0] == '[') {
                              local_470 = local_438 + 1;
                            }
                            while( true ) {
                              uVar10 = false;
                              if (local_468 != 0) {
                                uVar10 = local_460 < *in_R8;
                              }
                              if ((bool)uVar10 == false) break;
                              fVar8 = strtof(local_470,&local_478);
                              uVar7 = local_460 + 1;
                              *(float *)((long)local_458 + local_460 * 4) = fVar8;
                              pcVar6 = local_478 + 1;
                              if (local_478[1] == ' ') {
                                pcVar6 = local_478 + 2;
                              }
                              local_478 = pcVar6;
                              local_460 = uVar7;
                              if (local_438 + local_468 <= local_478) break;
                              local_470 = local_478;
                            }
                            pcVar6 = strchr(local_438,0x5d);
                          } while ((pcVar6 == (char *)0x0) &&
                                  (iVar1 = FmsIOReadLine(ctx_00,(char *)CONCAT17(uVar10,CONCAT16(
                                                  in_stack_fffffffffffffb06,
                                                  CONCAT15(in_stack_fffffffffffffb05,
                                                           CONCAT14(in_stack_fffffffffffffb04,
                                                                    in_stack_fffffffffffffb00))))),
                                  iVar1 == 0));
                          *in_RCX = local_458;
                          break;
                        case (FmsIOContext *)0x1:
                          local_480 = malloc(*in_R8 << 3);
                          local_488 = 0;
                          do {
                            local_490 = strlen(local_438);
                            local_498 = local_438;
                            local_4a0 = (char *)0x0;
                            if (local_438[0] == '[') {
                              local_498 = local_438 + 1;
                            }
                            while( true ) {
                              uVar10 = false;
                              if (local_490 != 0) {
                                uVar10 = local_488 < *in_R8;
                              }
                              if ((bool)uVar10 == false) break;
                              dVar9 = strtod(local_498,&local_4a0);
                              uVar7 = local_488 + 1;
                              *(double *)((long)local_480 + local_488 * 8) = dVar9;
                              pcVar6 = local_4a0 + 1;
                              if (local_4a0[1] == ' ') {
                                pcVar6 = local_4a0 + 2;
                              }
                              local_4a0 = pcVar6;
                              local_488 = uVar7;
                              if (local_438 + local_490 <= local_4a0) break;
                              local_498 = local_4a0;
                            }
                            pcVar6 = strchr(local_438,0x5d);
                          } while ((pcVar6 == (char *)0x0) &&
                                  (iVar1 = FmsIOReadLine(ctx_00,(char *)CONCAT17(
                                                  in_stack_fffffffffffffb07,
                                                  CONCAT16(uVar10,CONCAT15(in_stack_fffffffffffffb05
                                                                           ,CONCAT14(
                                                  in_stack_fffffffffffffb04,
                                                  in_stack_fffffffffffffb00))))), iVar1 == 0));
                          *in_RCX = local_480;
                          break;
                        case (FmsIOContext *)0x2:
                          local_4a8 = malloc(*in_R8 << 3);
                          local_4b0 = 0;
                          do {
                            local_4b8 = strlen(local_438);
                            local_4c0 = local_438;
                            local_4c8 = (char *)0x0;
                            if (local_438[0] == '[') {
                              local_4c0 = local_438 + 1;
                            }
                            while( true ) {
                              uVar10 = false;
                              if (local_4b8 != 0) {
                                uVar10 = local_4b0 < *in_R8 << 1;
                              }
                              if ((bool)uVar10 == false) break;
                              fVar8 = strtof(local_4c0,&local_4c8);
                              uVar7 = local_4b0 + 1;
                              *(float *)((long)local_4a8 + local_4b0 * 4) = fVar8;
                              pcVar6 = local_4c8 + 1;
                              if (local_4c8[1] == ' ') {
                                pcVar6 = local_4c8 + 2;
                              }
                              local_4c8 = pcVar6;
                              local_4b0 = uVar7;
                              if (local_438 + local_4b8 <= local_4c8) break;
                              local_4c0 = local_4c8;
                            }
                            pcVar6 = strchr(local_438,0x5d);
                          } while ((pcVar6 == (char *)0x0) &&
                                  (iVar1 = FmsIOReadLine(ctx_00,(char *)CONCAT17(
                                                  in_stack_fffffffffffffb07,
                                                  CONCAT16(in_stack_fffffffffffffb06,
                                                           CONCAT15(uVar10,CONCAT14(
                                                  in_stack_fffffffffffffb04,
                                                  in_stack_fffffffffffffb00))))), iVar1 == 0));
                          *in_RCX = local_4a8;
                          break;
                        case (FmsIOContext *)0x3:
                          pvVar4 = malloc(*in_R8 << 4);
                          local_4d8 = 0;
                          do {
                            sVar5 = strlen(local_438);
                            local_4e8 = local_438;
                            pcVar6 = (char *)0x0;
                            if (local_438[0] == '[') {
                              local_4e8 = local_438 + 1;
                            }
                            do {
                              uVar10 = false;
                              if (sVar5 != 0) {
                                uVar10 = local_4d8 < *in_R8 << 1;
                              }
                              if ((bool)uVar10 == false) break;
                              dVar9 = strtod(local_4e8,(char **)&stack0xfffffffffffffb10);
                              uVar7 = local_4d8 + 1;
                              *(double *)((long)pvVar4 + local_4d8 * 8) = dVar9;
                              local_4e8 = pcVar6 + 1;
                              if (*local_4e8 == ' ') {
                                local_4e8 = pcVar6 + 2;
                              }
                              pcVar6 = local_4e8;
                              local_4d8 = uVar7;
                            } while (local_4e8 < local_438 + sVar5);
                            pcVar6 = strchr(local_438,0x5d);
                          } while ((pcVar6 == (char *)0x0) &&
                                  (iVar1 = FmsIOReadLine(ctx_00,(char *)CONCAT17(
                                                  in_stack_fffffffffffffb07,
                                                  CONCAT16(in_stack_fffffffffffffb06,
                                                           CONCAT15(in_stack_fffffffffffffb05,
                                                                    CONCAT14(uVar10,
                                                  in_stack_fffffffffffffb00))))), iVar1 == 0));
                          *in_RCX = pvVar4;
                          break;
                        default:
                          return 0x10;
                        }
                        local_4 = 0;
                      }
                      else {
                        local_4 = 0xf;
                      }
                    }
                    else {
                      local_4 = 0xe;
                    }
                  }
                }
                else {
                  local_4 = 0xc;
                }
              }
              else {
                local_4 = 0xb;
              }
            }
            else {
              local_4 = 10;
            }
          }
        }
      }
      else {
        local_4 = 7;
      }
    }
    else {
      local_4 = 6;
    }
  }
  return local_4;
}

Assistant:

static int
FmsIOGetScalarArray(FmsIOContext *ctx, const char *path, FmsScalarType *type,
                    void **values, FmsInt *n) {
  int err = 0;
  char k[FMS_BUFFER_SIZE], v[FMS_BUFFER_SIZE];
  if(!ctx) E_RETURN(1);
  if(!path) E_RETURN(2);
  if(!type) E_RETURN(3);
  if(!values) E_RETURN(4);
  if(!n) E_RETURN(5);

  /* Arrays are written like:
      path/Size: n
      path/Type: type
      path/Values: [1,2,3,
      4,5,6
      7,8,9]
  */

  {
    // Error reading line
    if(FmsIOReadKeyValue(ctx, k, v))
      E_RETURN(6);

    char *ksize = join_keys(path, "Size");
    err = strcmp(k, ksize);
    FREE(ksize);
    // Path & key didn't match
    if(err)
      E_RETURN(7);

    *n = StrToFmsInt(v, NULL, 10);

    if (errno == ERANGE) { E_RETURN(8); }
    if (errno == EINVAL) { E_RETURN(9); }
  }

  {
    // Error reading line
    if(FmsIOReadKeyValue(ctx, k, v))
      E_RETURN(10);

    char *ktype= join_keys(path, "Type");
    err = strcmp(k, ktype);
    FREE(ktype);
    // Path & key didn't match
    if(err)
      E_RETURN(11);

    if(FmsGetScalarTypeFromName(v, type))
      E_RETURN(12);
  }

  // Values does not get written if Size == 0
  if(*n == 0)
    return 0;

  if(FmsIOReadKeyValue(ctx, k, v))
    E_RETURN(14);

  char *kvalues = join_keys(path, "Values");
  err = strcmp(k, kvalues);
  FREE(kvalues);
  if(err)
    E_RETURN(15);

// Had to remake this for scalar because strto(f/d) doesn't take a base
#define READ_ARRAY_DATA(DEST_T, FUNC, SIZE) \
do { \
    DEST_T *data = malloc(sizeof(DEST_T) * SIZE); \
    FmsInt i = 0; \
    while(1) { \
        size_t len = strlen(v); \
        char *off = v, *newoff = NULL; \
        if(off[0] == '[') \
            off++; \
        while(len && i < SIZE) { \
            data[i++] = (DEST_T)FUNC(off, &newoff); \
            newoff++; \
            if(*newoff == ' ') newoff++; /* Current flaw in the file format, last element has no trialing space */ \
            if(newoff >= v + len) break; \
            off = newoff; \
        }